

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O1

int __thiscall google::protobuf::io::GzipOutputStream::Deflate(GzipOutputStream *this,int flush)

{
  void **ppvVar1;
  int *piVar2;
  uInt uVar3;
  Bytef *pBVar4;
  int iVar5;
  string *psVar6;
  uInt *extraout_RDX;
  ulong uVar7;
  GzipOutputStream *this_00;
  LogMessageDebugFatal aLStack_78 [16];
  GzipOutputStream *pGStack_68;
  void **ppvStack_60;
  int *piStack_58;
  ulong uStack_50;
  
  uVar7 = (ulong)(uint)flush;
  ppvVar1 = &this->sub_data_;
  piVar2 = &this->sub_data_size_;
  do {
    if ((this->sub_data_ == (void *)0x0) || ((this->zcontext_).avail_out == 0)) {
      uStack_50 = 0x2adbb4;
      iVar5 = (*this->sub_stream_->_vptr_ZeroCopyOutputStream[2])(this->sub_stream_,ppvVar1,piVar2);
      if ((char)iVar5 == '\0') {
        *ppvVar1 = (void *)0x0;
        *piVar2 = 0;
      }
      else {
        if ((long)*piVar2 < 1) {
          uStack_50 = 0x2adc15;
          psVar6 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             ((long)*piVar2,0,"sub_data_size_ > 0");
        }
        else {
          psVar6 = (string *)0x0;
        }
        if (psVar6 != (string *)0x0) {
          this_00 = (GzipOutputStream *)&stack0xffffffffffffffc0;
          uStack_50 = 0x2adc5f;
          Deflate();
          if ((this_00->zerror_ == 0) || (this_00->zerror_ == -5)) {
            pGStack_68 = this;
            ppvStack_60 = ppvVar1;
            piStack_58 = piVar2;
            uStack_50 = uVar7;
            if ((this_00->zcontext_).avail_in != 0) {
              uVar7 = 0;
              iVar5 = Deflate(this_00,0);
              this_00->zerror_ = iVar5;
              if (iVar5 != 0) {
                return 0;
              }
            }
            if ((this_00->zcontext_).avail_in == 0) {
              pBVar4 = (Bytef *)this_00->input_buffer_;
              (this_00->zcontext_).next_in = pBVar4;
              uVar3 = (uInt)this_00->input_buffer_length_;
              (this_00->zcontext_).avail_in = uVar3;
              *(Bytef **)psVar6 = pBVar4;
              *extraout_RDX = uVar3;
            }
            else {
              absl::lts_20240722::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                        (aLStack_78,
                         "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/io/gzip_stream.cc"
                         ,0x113);
              absl::lts_20240722::log_internal::LogMessage::
              CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                        (aLStack_78,0x1d,"Deflate left bytes unconsumed");
              absl::lts_20240722::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                        (aLStack_78);
            }
            iVar5 = (int)CONCAT71((int7)(uVar7 >> 8),1);
          }
          else {
            iVar5 = 0;
          }
          return iVar5;
        }
        (this->zcontext_).next_out = (Bytef *)this->sub_data_;
        (this->zcontext_).avail_out = this->sub_data_size_;
      }
      if ((char)iVar5 == '\0') {
        return -5;
      }
    }
    uStack_50 = 0x2adbfb;
    iVar5 = deflate(&this->zcontext_,uVar7);
    if (iVar5 != 0 || (this->zcontext_).avail_out != 0) {
      if (flush - 3U < 2) {
        uStack_50 = 0x2adc29;
        (*this->sub_stream_->_vptr_ZeroCopyOutputStream[3])();
        this->sub_data_ = (void *)0x0;
        this->sub_data_size_ = 0;
      }
      return iVar5;
    }
  } while( true );
}

Assistant:

int GzipOutputStream::Deflate(int flush) {
  int error = Z_OK;
  do {
    if ((sub_data_ == NULL) || (zcontext_.avail_out == 0)) {
      bool ok = sub_stream_->Next(&sub_data_, &sub_data_size_);
      if (!ok) {
        sub_data_ = NULL;
        sub_data_size_ = 0;
        return Z_BUF_ERROR;
      }
      ABSL_CHECK_GT(sub_data_size_, 0);
      zcontext_.next_out = static_cast<Bytef*>(sub_data_);
      zcontext_.avail_out = sub_data_size_;
    }
    error = deflate(&zcontext_, flush);
  } while (error == Z_OK && zcontext_.avail_out == 0);
  if ((flush == Z_FULL_FLUSH) || (flush == Z_FINISH)) {
    // Notify lower layer of data.
    sub_stream_->BackUp(zcontext_.avail_out);
    // We don't own the buffer anymore.
    sub_data_ = NULL;
    sub_data_size_ = 0;
  }
  return error;
}